

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

C_Node * create_lvar_init(C_Parser *parser,Initializer *init,C_Type *ty,InitDesg *desg,C_Token *tok)

{
  TypeKind TVar1;
  C_Node *pCVar2;
  C_Node *pCVar3;
  C_Node *pCVar4;
  C_Member *pCVar5;
  int i;
  long lVar6;
  InitDesg desg2;
  
  TVar1 = ty->kind;
  if (TVar1 == TY_UNION) {
    desg2.member = init->mem;
    if (desg2.member == (C_Member *)0x0) {
      desg2.member = ty->members;
    }
    desg2.idx = 0;
    desg2.var = (C_Obj *)0x0;
    desg2.next = desg;
    pCVar2 = create_lvar_init(parser,init->children[(desg2.member)->idx],(desg2.member)->ty,&desg2,
                              tok);
    return pCVar2;
  }
  if (TVar1 == TY_STRUCT) {
    if (init->expr == (C_Node *)0x0) {
      pCVar2 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar2->kind = ND_NULL_EXPR;
      pCVar5 = (C_Member *)&ty->members;
      pCVar2->tok = tok;
      while (pCVar5 = pCVar5->next, pCVar5 != (C_Member *)0x0) {
        desg2.idx = 0;
        desg2.var = (C_Obj *)0x0;
        desg2.next = desg;
        desg2.member = pCVar5;
        pCVar3 = create_lvar_init(parser,init->children[pCVar5->idx],pCVar5->ty,&desg2,tok);
        pCVar4 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar4->kind = ND_COMMA;
        pCVar4->tok = tok;
        pCVar4->lhs = pCVar2;
        pCVar4->rhs = pCVar3;
        pCVar2 = pCVar4;
      }
      return pCVar2;
    }
  }
  else {
    if (TVar1 == TY_ARRAY) {
      pCVar2 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar2->kind = ND_NULL_EXPR;
      pCVar2->tok = tok;
      for (lVar6 = 0; lVar6 < ty->array_len; lVar6 = lVar6 + 1) {
        desg2.idx = (int)lVar6;
        desg2.member = (C_Member *)0x0;
        desg2.var = (C_Obj *)0x0;
        desg2.next = desg;
        pCVar3 = create_lvar_init(parser,init->children[lVar6],ty->base,&desg2,tok);
        pCVar4 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar4->kind = ND_COMMA;
        pCVar4->tok = tok;
        pCVar4->lhs = pCVar2;
        pCVar4->rhs = pCVar3;
        pCVar2 = pCVar4;
      }
      return pCVar2;
    }
    if (init->expr == (C_Node *)0x0) {
      pCVar2 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar2->kind = ND_NULL_EXPR;
      pCVar2->tok = tok;
      return pCVar2;
    }
  }
  pCVar3 = init_desg_expr(parser,desg,tok);
  pCVar2 = init->expr;
  pCVar4 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
  pCVar4->kind = ND_ASSIGN;
  pCVar4->tok = tok;
  pCVar4->lhs = pCVar3;
  pCVar4->rhs = pCVar2;
  return pCVar4;
}

Assistant:

static C_Node *create_lvar_init(C_Parser *parser, Initializer *init, C_Type *ty, InitDesg *desg, C_Token *tok) {
  if (ty->kind == TY_ARRAY) {
    C_Node *node = new_node(parser, ND_NULL_EXPR, tok);
    for (int i = 0; i < ty->array_len; i++) {
      InitDesg desg2 = {desg, i};
      C_Node *rhs = create_lvar_init(parser, init->children[i], ty->base, &desg2, tok);
      node = new_binary(parser, ND_COMMA, node, rhs, tok);
    }
    return node;
  }

  if (ty->kind == TY_STRUCT && !init->expr) {
    C_Node *node = new_node(parser, ND_NULL_EXPR, tok);

    for (C_Member *mem = ty->members; mem; mem = mem->next) {
      InitDesg desg2 = {desg, 0, mem};
      C_Node *rhs = create_lvar_init(parser, init->children[mem->idx], mem->ty, &desg2, tok);
      node = new_binary(parser, ND_COMMA, node, rhs, tok);
    }
    return node;
  }

  if (ty->kind == TY_UNION) {
    C_Member *mem = init->mem ? init->mem : ty->members;
    InitDesg desg2 = {desg, 0, mem};
    return create_lvar_init(parser, init->children[mem->idx], mem->ty, &desg2, tok);
  }

  if (!init->expr)
    return new_node(parser, ND_NULL_EXPR, tok);

  C_Node *lhs = init_desg_expr(parser, desg, tok);
  return new_binary(parser, ND_ASSIGN, lhs, init->expr, tok);
}